

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O0

QCborArray QCborArray::fromStringList(QStringList *list)

{
  undefined1 uVar1;
  const_iterator o;
  QString *s_00;
  QList<QString> *in_RSI;
  QExplicitlySharedDataPointer<QCborContainerPrivate> in_RDI;
  long in_FS_OFFSET;
  QString *s;
  QStringList *__range1;
  QCborArray *a;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QString> *in_stack_ffffffffffffff80;
  qsizetype in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QCborArray((QCborArray *)0x48c1ba);
  QList<QString>::size(in_RSI);
  detach((QCborArray *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
         in_stack_ffffffffffffff88);
  local_10.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QString>::begin(in_stack_ffffffffffffff80);
  o = QList<QString>::end(in_stack_ffffffffffffff80);
  while (uVar1 = QList<QString>::const_iterator::operator!=(&local_10,o), (bool)uVar1) {
    s_00 = QList<QString>::const_iterator::operator*(&local_10);
    QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
              ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x48c27f);
    QCborContainerPrivate::append
              ((QCborContainerPrivate *)CONCAT17(uVar1,in_stack_ffffffffffffff90),s_00);
    QList<QString>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
         (QExplicitlySharedDataPointer<QCborContainerPrivate>)in_RDI.d.ptr;
}

Assistant:

QCborArray QCborArray::fromStringList(const QStringList &list)
{
    QCborArray a;
    a.detach(list.size());
    for (const QString &s : list)
        a.d->append(s);
    return a;
}